

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf256.cpp
# Opt level: O3

int gf256_init_(int version)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  short sVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  long lVar12;
  uint8_t *puVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  ushort uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [32];
  
  iVar17 = -1;
  if ((version == 2) && (iVar17 = 0, Initialized == '\0')) {
    bVar20 = 1;
    Initialized = '\x01';
    lVar12 = cpuid_Version_info(1);
    CpuHasSSSE3 = (bool)((byte)(*(uint *)(lVar12 + 0xc) >> 9) & 1);
    lVar12 = cpuid_Extended_Feature_Enumeration_info(7);
    bVar19 = (byte)*(undefined4 *)(lVar12 + 4) >> 5;
    CpuHasAVX2 = (bool)(bVar19 & 1);
    GF256Ctx.Polynomial = 0x14d;
    GF256Ctx.GF256_LOG_TABLE[0] = 0x200;
    GF256Ctx.GF256_EXP_TABLE[0] = '\x01';
    lVar12 = -0xfe;
    do {
      sVar9 = (short)lVar12;
      bVar21 = 0;
      if ((char)bVar20 < '\0') {
        bVar21 = 0x4d;
      }
      bVar20 = bVar21 ^ bVar20 * '\x02';
      GF256Ctx.GF256_EXP_TABLE[lVar12 + 0xff] = bVar20;
      lVar12 = lVar12 + 1;
      GF256Ctx.GF256_LOG_TABLE[bVar20] = sVar9 + 0xff;
    } while (lVar12 != 0);
    auVar33 = vpmovsxbq_avx512f(ZEXT816(0x3f3e3d3c3b3a3938));
    auVar34 = vpmovsxbq_avx512f(ZEXT816(0x3736353433323130));
    auVar35 = vpmovsxbq_avx512f(ZEXT816(0x2f2e2d2c2b2a2928));
    auVar36 = vpmovsxbq_avx512f(ZEXT816(0x2726252423222120));
    auVar37 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
    auVar38 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
    auVar39 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar40 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar41 = vpbroadcastq_avx512f(ZEXT816(0xfe));
    GF256Ctx.GF256_EXP_TABLE[0xff] = '\x01';
    lVar12 = 0;
    GF256Ctx.GF256_LOG_TABLE[1] = 0xff;
    do {
      auVar42 = vpbroadcastq_avx512f();
      auVar43 = vporq_avx512f(auVar42,auVar33);
      auVar44 = vporq_avx512f(auVar42,auVar37);
      auVar45 = vporq_avx512f(auVar42,auVar39);
      auVar46 = vporq_avx512f(auVar42,auVar34);
      auVar47 = vporq_avx512f(auVar42,auVar35);
      auVar48 = vporq_avx512f(auVar42,auVar36);
      auVar49 = vporq_avx512f(auVar42,auVar38);
      auVar42 = vporq_avx512f(auVar42,auVar40);
      uVar2 = vpcmpuq_avx512f(auVar42,auVar41,1);
      uVar3 = vpcmpuq_avx512f(auVar45,auVar41,1);
      uVar4 = vpcmpuq_avx512f(auVar44,auVar41,1);
      uVar5 = vpcmpuq_avx512f(auVar43,auVar41,1);
      bVar20 = (byte)uVar5;
      uVar5 = vpcmpuq_avx512f(auVar49,auVar41,1);
      uVar6 = vpcmpuq_avx512f(auVar47,auVar41,1);
      uVar7 = vpcmpuq_avx512f(auVar48,auVar41,1);
      uVar8 = vpcmpuq_avx512f(auVar46,auVar41,1);
      uVar26 = CONCAT11(bVar20,(byte)uVar8);
      uVar25 = CONCAT22(uVar26,CONCAT11((byte)uVar6,(byte)uVar7));
      uVar15 = CONCAT44(uVar25,CONCAT22(CONCAT11((byte)uVar4,(byte)uVar5),
                                        CONCAT11((byte)uVar3,(byte)uVar2)));
      auVar42 = vmovdqu8_avx512bw(*(undefined1 (*) [64])(GF256Ctx.GF256_EXP_TABLE + lVar12 + 1));
      auVar43[1] = ((byte)(uVar15 >> 1) & 1) * auVar42[1];
      auVar43[0] = ((byte)uVar2 & 1) * auVar42[0];
      auVar43[2] = ((byte)(uVar15 >> 2) & 1) * auVar42[2];
      auVar43[3] = ((byte)(uVar15 >> 3) & 1) * auVar42[3];
      auVar43[4] = ((byte)(uVar15 >> 4) & 1) * auVar42[4];
      auVar43[5] = ((byte)(uVar15 >> 5) & 1) * auVar42[5];
      auVar43[6] = ((byte)(uVar15 >> 6) & 1) * auVar42[6];
      auVar43[7] = ((byte)(uVar15 >> 7) & 1) * auVar42[7];
      auVar43[8] = ((byte)uVar3 & 1) * auVar42[8];
      auVar43[9] = ((byte)(uVar15 >> 9) & 1) * auVar42[9];
      auVar43[10] = ((byte)(uVar15 >> 10) & 1) * auVar42[10];
      auVar43[0xb] = ((byte)(uVar15 >> 0xb) & 1) * auVar42[0xb];
      auVar43[0xc] = ((byte)(uVar15 >> 0xc) & 1) * auVar42[0xc];
      auVar43[0xd] = ((byte)(uVar15 >> 0xd) & 1) * auVar42[0xd];
      auVar43[0xe] = ((byte)(uVar15 >> 0xe) & 1) * auVar42[0xe];
      auVar43[0xf] = ((byte)(uVar15 >> 0xf) & 1) * auVar42[0xf];
      auVar43[0x10] = ((byte)uVar5 & 1) * auVar42[0x10];
      auVar43[0x11] = ((byte)(uVar15 >> 0x11) & 1) * auVar42[0x11];
      auVar43[0x12] = ((byte)(uVar15 >> 0x12) & 1) * auVar42[0x12];
      auVar43[0x13] = ((byte)(uVar15 >> 0x13) & 1) * auVar42[0x13];
      auVar43[0x14] = ((byte)(uVar15 >> 0x14) & 1) * auVar42[0x14];
      auVar43[0x15] = ((byte)(uVar15 >> 0x15) & 1) * auVar42[0x15];
      auVar43[0x16] = ((byte)(uVar15 >> 0x16) & 1) * auVar42[0x16];
      auVar43[0x17] = ((byte)(uVar15 >> 0x17) & 1) * auVar42[0x17];
      auVar43[0x18] = ((byte)uVar4 & 1) * auVar42[0x18];
      auVar43[0x19] = ((byte)(uVar15 >> 0x19) & 1) * auVar42[0x19];
      auVar43[0x1a] = ((byte)(uVar15 >> 0x1a) & 1) * auVar42[0x1a];
      auVar43[0x1b] = ((byte)(uVar15 >> 0x1b) & 1) * auVar42[0x1b];
      auVar43[0x1c] = ((byte)(uVar15 >> 0x1c) & 1) * auVar42[0x1c];
      auVar43[0x1d] = ((byte)(uVar15 >> 0x1d) & 1) * auVar42[0x1d];
      auVar43[0x1e] = ((byte)(uVar15 >> 0x1e) & 1) * auVar42[0x1e];
      auVar43[0x1f] = ((byte)(uVar15 >> 0x1f) & 1) * auVar42[0x1f];
      auVar43[0x20] = ((byte)uVar7 & 1) * auVar42[0x20];
      auVar43[0x21] = ((byte)(uVar25 >> 1) & 1) * auVar42[0x21];
      auVar43[0x22] = ((byte)(uVar25 >> 2) & 1) * auVar42[0x22];
      auVar43[0x23] = ((byte)(uVar25 >> 3) & 1) * auVar42[0x23];
      auVar43[0x24] = ((byte)(uVar25 >> 4) & 1) * auVar42[0x24];
      auVar43[0x25] = ((byte)(uVar25 >> 5) & 1) * auVar42[0x25];
      auVar43[0x26] = ((byte)(uVar25 >> 6) & 1) * auVar42[0x26];
      auVar43[0x27] = ((byte)(uVar25 >> 7) & 1) * auVar42[0x27];
      auVar43[0x28] = ((byte)uVar6 & 1) * auVar42[0x28];
      auVar43[0x29] = ((byte)(uVar25 >> 9) & 1) * auVar42[0x29];
      auVar43[0x2a] = ((byte)(uVar25 >> 10) & 1) * auVar42[0x2a];
      auVar43[0x2b] = ((byte)(uVar25 >> 0xb) & 1) * auVar42[0x2b];
      auVar43[0x2c] = ((byte)(uVar25 >> 0xc) & 1) * auVar42[0x2c];
      auVar43[0x2d] = ((byte)(uVar25 >> 0xd) & 1) * auVar42[0x2d];
      auVar43[0x2e] = ((byte)(uVar25 >> 0xe) & 1) * auVar42[0x2e];
      auVar43[0x2f] = ((byte)(uVar25 >> 0xf) & 1) * auVar42[0x2f];
      auVar43[0x30] = ((byte)uVar8 & 1) * auVar42[0x30];
      auVar43[0x31] = ((byte)(uVar26 >> 1) & 1) * auVar42[0x31];
      auVar43[0x32] = ((byte)(uVar26 >> 2) & 1) * auVar42[0x32];
      auVar43[0x33] = ((byte)(uVar26 >> 3) & 1) * auVar42[0x33];
      auVar43[0x34] = ((byte)(uVar26 >> 4) & 1) * auVar42[0x34];
      auVar43[0x35] = ((byte)(uVar26 >> 5) & 1) * auVar42[0x35];
      auVar43[0x36] = ((byte)(uVar26 >> 6) & 1) * auVar42[0x36];
      auVar43[0x37] = ((byte)(uVar26 >> 7) & 1) * auVar42[0x37];
      auVar43[0x38] = (bVar20 & 1) * auVar42[0x38];
      auVar43[0x39] = (bVar20 >> 1 & 1) * auVar42[0x39];
      auVar43[0x3a] = (bVar20 >> 2 & 1) * auVar42[0x3a];
      auVar43[0x3b] = (bVar20 >> 3 & 1) * auVar42[0x3b];
      auVar43[0x3c] = (bVar20 >> 4 & 1) * auVar42[0x3c];
      auVar43[0x3d] = (bVar20 >> 5 & 1) * auVar42[0x3d];
      auVar43[0x3e] = (bVar20 >> 6 & 1) * auVar42[0x3e];
      auVar43[0x3f] = -((char)bVar20 >> 7) * auVar42[0x3f];
      auVar42 = vmovdqu8_avx512bw(auVar43);
      *(undefined1 (*) [64])(GF256Ctx.GF256_EXP_TABLE + lVar12 + 0x100) = auVar42;
      lVar12 = lVar12 + 0x40;
    } while (lVar12 != 0x100);
    auVar34 = ZEXT1664((undefined1  [16])0x0);
    lVar12 = 0x1e7e80;
    lVar14 = 0x1f7e80;
    lVar16 = 0x1f7f81;
    lVar22 = 1;
    GF256Ctx.GF256_EXP_TABLE[0x1fe] = '\x01';
    auVar33 = vmovdqu64_avx512f(auVar34);
    GF256Ctx.GF256_EXP_TABLE._895_61_ = auVar33._0_61_;
    GF256Ctx.GF256_EXP_TABLE._511_64_ = vmovdqu64_avx512f(auVar34);
    GF256Ctx.GF256_EXP_TABLE._575_64_ = vmovdqu64_avx512f(auVar34);
    GF256Ctx.GF256_EXP_TABLE._639_64_ = vmovdqu64_avx512f(auVar34);
    GF256Ctx.GF256_EXP_TABLE._703_64_ = vmovdqu64_avx512f(auVar34);
    GF256Ctx.GF256_EXP_TABLE._767_64_ = vmovdqu64_avx512f(auVar34);
    GF256Ctx.GF256_EXP_TABLE._831_64_ = vmovdqu64_avx512f(auVar34);
    auVar33 = vmovdqu64_avx512f(auVar34);
    GF256Ctx.GF256_EXP_TABLE._956_3_ = auVar33._0_3_;
    GF256Ctx.GF256_EXP_TABLE._959_61_ = auVar33._3_61_;
    GF256Ctx.GF256_MUL_TABLE._0_64_ = vmovdqu64_avx512f(auVar34);
    GF256Ctx.GF256_MUL_TABLE._64_64_ = vmovdqu64_avx512f(auVar34);
    GF256Ctx.GF256_MUL_TABLE._128_64_ = vmovdqu64_avx512f(auVar34);
    GF256Ctx.GF256_MUL_TABLE._192_64_ = vmovdqu64_avx512f(auVar34);
    GF256Ctx.GF256_DIV_TABLE._0_64_ = vmovdqu64_avx512f(auVar34);
    GF256Ctx.GF256_DIV_TABLE._64_64_ = vmovdqu64_avx512f(auVar34);
    GF256Ctx.GF256_DIV_TABLE._128_64_ = vmovdqu64_avx512f(auVar34);
    GF256Ctx.GF256_DIV_TABLE._192_64_ = vmovdqu64_avx512f(auVar34);
    do {
      bVar20 = (byte)GF256Ctx.GF256_LOG_TABLE[lVar22];
      *(undefined1 *)(lVar12 + 0x100) = 0;
      *(undefined1 *)(lVar14 + 0x100) = 0;
      lVar12 = lVar12 + 0x100;
      lVar14 = lVar14 + 0x100;
      lVar18 = 0;
      do {
        uVar26 = GF256Ctx.GF256_LOG_TABLE[lVar18 + 1];
        *(uint8_t *)(lVar16 + -0x10000 + lVar18) =
             GF256Ctx.GF256_EXP_TABLE[(ulong)uVar26 + (ulong)bVar20];
        *(uint8_t *)(lVar16 + lVar18) =
             GF256Ctx.GF256_EXP_TABLE[(ulong)uVar26 + (ulong)(bVar20 ^ 0xff)];
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0xff);
      lVar22 = lVar22 + 1;
      lVar16 = lVar16 + 0x100;
    } while (lVar22 != 0x100);
    puVar13 = GF256Ctx.GF256_INV_TABLE;
    lVar12 = -0x10000;
    do {
      *puVar13 = GF256Ctx.GF256_INV_TABLE[lVar12 + 1];
      puVar13 = puVar13 + 1;
      lVar12 = lVar12 + 0x100;
    } while (lVar12 != 0);
    auVar33 = vpmovsxbq_avx512f(ZEXT816(0x3f3e3d3c3b3a3938));
    auVar34 = vpmovsxbq_avx512f(ZEXT816(0x3736353433323130));
    auVar35 = vpmovsxbq_avx512f(ZEXT816(0x2f2e2d2c2b2a2928));
    auVar36 = vpmovsxbq_avx512f(ZEXT816(0x2726252423222120));
    auVar37 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
    auVar38 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
    auVar39 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar40 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar41 = vpbroadcastq_avx512f(ZEXT816(0x40));
    lVar12 = 0;
    do {
      auVar42 = vpsllq_avx512f(auVar38,8);
      auVar43 = vpsllq_avx512f(auVar40,8);
      auVar44 = vpsllq_avx512f(auVar37,8);
      auVar45 = vpsllq_avx512f(auVar34,8);
      auVar46 = vpsllq_avx512f(auVar33,8);
      auVar42 = vpaddq_avx512f(auVar42,auVar38);
      auVar43 = vpaddq_avx512f(auVar43,auVar40);
      auVar44 = vpaddq_avx512f(auVar44,auVar37);
      auVar47 = vpsllq_avx512f(auVar39,8);
      auVar45 = vpaddq_avx512f(auVar45,auVar34);
      auVar46 = vpaddq_avx512f(auVar46,auVar33);
      auVar40 = vpaddq_avx512f(auVar40,auVar41);
      auVar38 = vpaddq_avx512f(auVar38,auVar41);
      auVar37 = vpaddq_avx512f(auVar37,auVar41);
      auVar34 = vpaddq_avx512f(auVar34,auVar41);
      auVar33 = vpaddq_avx512f(auVar33,auVar41);
      auVar27 = vextracti32x4_avx512vl(auVar42._0_32_,1);
      auVar28 = vextracti32x4_avx512f(auVar42,2);
      auVar47 = vpaddq_avx512f(auVar47,auVar39);
      auVar39 = vpaddq_avx512f(auVar39,auVar41);
      lVar14 = vpextrq_avx(auVar42._0_16_,1);
      auVar29 = vextracti32x4_avx512f(auVar42,3);
      auVar1 = vpinsrb_avx(ZEXT416(*(uint *)(GF256Ctx.GF256_MUL_TABLE + auVar42._0_8_)),
                           (uint)GF256Ctx.GF256_MUL_TABLE[lVar14],1);
      auVar1 = vpinsrb_avx(auVar1,(uint)GF256Ctx.GF256_MUL_TABLE[auVar27._0_8_],2);
      auVar30 = vextracti32x4_avx512vl(auVar43._0_32_,1);
      auVar1 = vpinsrb_avx(auVar1,(uint)GF256Ctx.GF256_MUL_TABLE[auVar27._8_8_],3);
      auVar1 = vpinsrb_avx(auVar1,(uint)GF256Ctx.GF256_MUL_TABLE[auVar28._0_8_],4);
      auVar1 = vpinsrb_avx(auVar1,(uint)GF256Ctx.GF256_MUL_TABLE[auVar28._8_8_],5);
      auVar1 = vpinsrb_avx(auVar1,(uint)GF256Ctx.GF256_MUL_TABLE[auVar29._0_8_],6);
      lVar14 = vpextrq_avx(auVar29,1);
      auVar1 = vpinsrb_avx(auVar1,(uint)GF256Ctx.GF256_MUL_TABLE[lVar14],7);
      auVar1 = vpinsrb_avx(auVar1,(uint)GF256Ctx.GF256_MUL_TABLE[auVar44._0_8_],8);
      lVar14 = vpextrq_avx(auVar44._0_16_,1);
      auVar1 = vpinsrb_avx(auVar1,(uint)GF256Ctx.GF256_MUL_TABLE[lVar14],9);
      auVar1 = vpinsrb_avx(auVar1,(uint)GF256Ctx.GF256_MUL_TABLE[auVar44._16_8_],10);
      lVar14 = vpextrq_avx(auVar44._16_16_,1);
      auVar27 = vextracti32x4_avx512f(auVar44,2);
      auVar28 = vextracti32x4_avx512f(auVar44,3);
      auVar1 = vpinsrb_avx(auVar1,(uint)GF256Ctx.GF256_MUL_TABLE[lVar14],0xb);
      auVar1 = vpinsrb_avx(auVar1,(uint)GF256Ctx.GF256_MUL_TABLE[auVar27._0_8_],0xc);
      lVar14 = vpextrq_avx(auVar27,1);
      auVar1 = vpinsrb_avx(auVar1,(uint)GF256Ctx.GF256_MUL_TABLE[lVar14],0xd);
      auVar1 = vpinsrb_avx(auVar1,(uint)GF256Ctx.GF256_MUL_TABLE[auVar28._0_8_],0xe);
      lVar14 = vpextrq_avx(auVar43._0_16_,1);
      auVar27 = vpinsrb_avx(ZEXT416(*(uint *)(GF256Ctx.GF256_MUL_TABLE + auVar43._0_8_)),
                            (uint)GF256Ctx.GF256_MUL_TABLE[lVar14],1);
      auVar27 = vpinsrb_avx(auVar27,(uint)GF256Ctx.GF256_MUL_TABLE[auVar30._0_8_],2);
      auVar29 = vextracti32x4_avx512f(auVar43,2);
      auVar31 = vextracti32x4_avx512f(auVar43,3);
      auVar27 = vpinsrb_avx(auVar27,(uint)GF256Ctx.GF256_MUL_TABLE[auVar30._8_8_],3);
      auVar27 = vpinsrb_avx(auVar27,(uint)GF256Ctx.GF256_MUL_TABLE[auVar29._0_8_],4);
      auVar30 = vextracti32x4_avx512f(auVar47,3);
      auVar27 = vpinsrb_avx(auVar27,(uint)GF256Ctx.GF256_MUL_TABLE[auVar29._8_8_],5);
      auVar27 = vpinsrb_avx(auVar27,(uint)GF256Ctx.GF256_MUL_TABLE[auVar31._0_8_],6);
      lVar14 = vpextrq_avx(auVar31,1);
      auVar27 = vpinsrb_avx(auVar27,(uint)GF256Ctx.GF256_MUL_TABLE[lVar14],7);
      auVar27 = vpinsrb_avx(auVar27,(uint)GF256Ctx.GF256_MUL_TABLE[auVar47._0_8_],8);
      lVar14 = vpextrq_avx(auVar47._0_16_,1);
      auVar27 = vpinsrb_avx(auVar27,(uint)GF256Ctx.GF256_MUL_TABLE[lVar14],9);
      auVar27 = vpinsrb_avx(auVar27,(uint)GF256Ctx.GF256_MUL_TABLE[auVar47._16_8_],10);
      lVar14 = vpextrq_avx(auVar47._16_16_,1);
      auVar29 = vextracti32x4_avx512f(auVar47,2);
      auVar27 = vpinsrb_avx(auVar27,(uint)GF256Ctx.GF256_MUL_TABLE[lVar14],0xb);
      auVar27 = vpinsrb_avx(auVar27,(uint)GF256Ctx.GF256_MUL_TABLE[auVar29._0_8_],0xc);
      lVar14 = vpextrq_avx(auVar29,1);
      auVar42 = vpsllq_avx512f(auVar36,8);
      auVar27 = vpinsrb_avx(auVar27,(uint)GF256Ctx.GF256_MUL_TABLE[lVar14],0xd);
      lVar14 = vpextrq_avx(auVar28,1);
      auVar1 = vpinsrb_avx(auVar1,(uint)GF256Ctx.GF256_MUL_TABLE[lVar14],0xf);
      auVar27 = vpinsrb_avx(auVar27,(uint)GF256Ctx.GF256_MUL_TABLE[auVar30._0_8_],0xe);
      lVar14 = vpextrq_avx(auVar45._0_16_,1);
      auVar28 = vpinsrb_avx(ZEXT416(*(uint *)(GF256Ctx.GF256_MUL_TABLE + auVar45._0_8_)),
                            (uint)GF256Ctx.GF256_MUL_TABLE[lVar14],1);
      auVar28 = vpinsrb_avx(auVar28,(uint)GF256Ctx.GF256_MUL_TABLE[auVar45._16_8_],2);
      lVar14 = vpextrq_avx(auVar45._16_16_,1);
      auVar29 = vextracti32x4_avx512f(auVar45,2);
      auVar28 = vpinsrb_avx(auVar28,(uint)GF256Ctx.GF256_MUL_TABLE[lVar14],3);
      auVar28 = vpinsrb_avx(auVar28,(uint)GF256Ctx.GF256_MUL_TABLE[auVar29._0_8_],4);
      lVar14 = vpextrq_avx(auVar29,1);
      auVar42 = vpaddq_avx512f(auVar42,auVar36);
      auVar29 = vextracti32x4_avx512f(auVar45,3);
      auVar36 = vpaddq_avx512f(auVar36,auVar41);
      auVar28 = vpinsrb_avx(auVar28,(uint)GF256Ctx.GF256_MUL_TABLE[lVar14],5);
      auVar27 = vpinsrb_avx(auVar27,(uint)GF256Ctx.GF256_MUL_TABLE[auVar30._8_8_],0xf);
      auVar28 = vpinsrb_avx(auVar28,(uint)GF256Ctx.GF256_MUL_TABLE[auVar29._0_8_],6);
      lVar14 = vpextrq_avx(auVar29,1);
      auVar28 = vpinsrb_avx(auVar28,(uint)GF256Ctx.GF256_MUL_TABLE[lVar14],7);
      auVar28 = vpinsrb_avx(auVar28,(uint)GF256Ctx.GF256_MUL_TABLE[auVar46._0_8_],8);
      lVar14 = vpextrq_avx(auVar46._0_16_,1);
      auVar28 = vpinsrb_avx(auVar28,(uint)GF256Ctx.GF256_MUL_TABLE[lVar14],9);
      auVar28 = vpinsrb_avx(auVar28,(uint)GF256Ctx.GF256_MUL_TABLE[auVar46._16_8_],10);
      lVar14 = vpextrq_avx(auVar46._16_16_,1);
      auVar29 = vextracti32x4_avx512f(auVar46,2);
      auVar30 = vextracti32x4_avx512f(auVar46,3);
      auVar28 = vpinsrb_avx(auVar28,(uint)GF256Ctx.GF256_MUL_TABLE[lVar14],0xb);
      auVar28 = vpinsrb_avx(auVar28,(uint)GF256Ctx.GF256_MUL_TABLE[auVar29._0_8_],0xc);
      lVar14 = vpextrq_avx(auVar29,1);
      auVar28 = vpinsrb_avx(auVar28,(uint)GF256Ctx.GF256_MUL_TABLE[lVar14],0xd);
      auVar28 = vpinsrb_avx(auVar28,(uint)GF256Ctx.GF256_MUL_TABLE[auVar30._0_8_],0xe);
      lVar14 = vpextrq_avx(auVar42._0_16_,1);
      auVar29 = vpinsrb_avx(ZEXT416(*(uint *)(GF256Ctx.GF256_MUL_TABLE + auVar42._0_8_)),
                            (uint)GF256Ctx.GF256_MUL_TABLE[lVar14],1);
      auVar29 = vpinsrb_avx(auVar29,(uint)GF256Ctx.GF256_MUL_TABLE[auVar42._16_8_],2);
      lVar14 = vpextrq_avx(auVar42._16_16_,1);
      auVar31 = vextracti32x4_avx512f(auVar42,2);
      auVar32 = vextracti32x4_avx512f(auVar42,3);
      auVar29 = vpinsrb_avx(auVar29,(uint)GF256Ctx.GF256_MUL_TABLE[lVar14],3);
      auVar29 = vpinsrb_avx(auVar29,(uint)GF256Ctx.GF256_MUL_TABLE[auVar31._0_8_],4);
      lVar14 = vpextrq_avx(auVar31,1);
      auVar42 = vpsllq_avx512f(auVar35,8);
      auVar42 = vpaddq_avx512f(auVar42,auVar35);
      auVar35 = vpaddq_avx512f(auVar35,auVar41);
      auVar29 = vpinsrb_avx(auVar29,(uint)GF256Ctx.GF256_MUL_TABLE[lVar14],5);
      lVar14 = vpextrq_avx(auVar30,1);
      auVar28 = vpinsrb_avx(auVar28,(uint)GF256Ctx.GF256_MUL_TABLE[lVar14],0xf);
      auVar29 = vpinsrb_avx(auVar29,(uint)GF256Ctx.GF256_MUL_TABLE[auVar32._0_8_],6);
      lVar14 = vpextrq_avx(auVar32,1);
      auVar29 = vpinsrb_avx(auVar29,(uint)GF256Ctx.GF256_MUL_TABLE[lVar14],7);
      auVar29 = vpinsrb_avx(auVar29,(uint)GF256Ctx.GF256_MUL_TABLE[auVar42._0_8_],8);
      lVar14 = vpextrq_avx(auVar42._0_16_,1);
      auVar29 = vpinsrb_avx(auVar29,(uint)GF256Ctx.GF256_MUL_TABLE[lVar14],9);
      auVar29 = vpinsrb_avx(auVar29,(uint)GF256Ctx.GF256_MUL_TABLE[auVar42._16_8_],10);
      lVar14 = vpextrq_avx(auVar42._16_16_,1);
      auVar30 = vextracti32x4_avx512f(auVar42,2);
      auVar29 = vpinsrb_avx(auVar29,(uint)GF256Ctx.GF256_MUL_TABLE[lVar14],0xb);
      auVar29 = vpinsrb_avx(auVar29,(uint)GF256Ctx.GF256_MUL_TABLE[auVar30._0_8_],0xc);
      lVar14 = vpextrq_avx(auVar30,1);
      auVar30 = vextracti32x4_avx512f(auVar42,3);
      auVar29 = vpinsrb_avx(auVar29,(uint)GF256Ctx.GF256_MUL_TABLE[lVar14],0xd);
      auVar29 = vpinsrb_avx(auVar29,(uint)GF256Ctx.GF256_MUL_TABLE[auVar30._0_8_],0xe);
      lVar14 = vpextrq_avx(auVar30,1);
      auVar29 = vpinsrb_avx(auVar29,(uint)GF256Ctx.GF256_MUL_TABLE[lVar14],0xf);
      auVar50._0_16_ = ZEXT116(0) * auVar28 + ZEXT116(1) * auVar29;
      auVar50._16_16_ = ZEXT116(1) * auVar28;
      auVar42 = vinserti64x4_avx512f
                          (ZEXT3264(CONCAT1616(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                                               ZEXT116(1) * auVar1,
                                               ZEXT116(0) * auVar1 + ZEXT116(1) * auVar27)),auVar50,
                           1);
      auVar42 = vmovdqu64_avx512f(auVar42);
      *(undefined1 (*) [64])(GF256Ctx.GF256_SQR_TABLE + lVar12) = auVar42;
      lVar12 = lVar12 + 0x40;
    } while (lVar12 != 0x100);
    auVar33 = vpmovzxbq_avx512f(ZEXT816(0xf0e0d0c0b0a09080));
    auVar34 = vpmovsxbq_avx512f(ZEXT816(0x7060504030201000));
    lVar12 = 0x1000;
    lVar14 = 0;
    do {
      auVar35 = vpbroadcastq_avx512f();
      auVar36 = vporq_avx512f(auVar35,auVar34);
      auVar35 = vporq_avx512f(auVar35,auVar33);
      lVar16 = vpextrq_avx(auVar36._0_16_,1);
      auVar1 = vpinsrb_avx(ZEXT416(*(uint *)(GF256Ctx.GF256_MUL_TABLE + lVar14)),
                           (uint)GF256Ctx.GF256_MUL_TABLE[lVar16],1);
      auVar1 = vpinsrb_avx(auVar1,(uint)GF256Ctx.GF256_MUL_TABLE[auVar36._16_8_],2);
      lVar16 = vpextrq_avx(auVar36._16_16_,1);
      auVar27 = vextracti32x4_avx512f(auVar36,2);
      auVar28 = vextracti32x4_avx512f(auVar36,3);
      auVar1 = vpinsrb_avx(auVar1,(uint)GF256Ctx.GF256_MUL_TABLE[lVar16],3);
      auVar1 = vpinsrb_avx(auVar1,(uint)GF256Ctx.GF256_MUL_TABLE[auVar27._0_8_],4);
      lVar16 = vpextrq_avx(auVar27,1);
      auVar1 = vpinsrb_avx(auVar1,(uint)GF256Ctx.GF256_MUL_TABLE[lVar16],5);
      auVar1 = vpinsrb_avx(auVar1,(uint)GF256Ctx.GF256_MUL_TABLE[auVar28._0_8_],6);
      lVar16 = vpextrq_avx(auVar28,1);
      auVar1 = vpinsrb_avx(auVar1,(uint)GF256Ctx.GF256_MUL_TABLE[lVar16],7);
      auVar1 = vpinsrb_avx(auVar1,(uint)GF256Ctx.GF256_MUL_TABLE[auVar35._0_8_],8);
      lVar16 = vpextrq_avx(auVar35._0_16_,1);
      auVar1 = vpinsrb_avx(auVar1,(uint)GF256Ctx.GF256_MUL_TABLE[lVar16],9);
      auVar1 = vpinsrb_avx(auVar1,(uint)GF256Ctx.GF256_MUL_TABLE[auVar35._16_8_],10);
      lVar16 = vpextrq_avx(auVar35._16_16_,1);
      auVar27 = vextracti32x4_avx512f(auVar35,2);
      auVar28 = vextracti32x4_avx512f(auVar35,3);
      auVar1 = vpinsrb_avx(auVar1,(uint)GF256Ctx.GF256_MUL_TABLE[lVar16],0xb);
      auVar1 = vpinsrb_avx(auVar1,(uint)GF256Ctx.GF256_MUL_TABLE[auVar27._0_8_],0xc);
      lVar16 = vpextrq_avx(auVar27,1);
      auVar1 = vpinsrb_avx(auVar1,(uint)GF256Ctx.GF256_MUL_TABLE[lVar16],0xd);
      auVar1 = vpinsrb_avx(auVar1,(uint)GF256Ctx.GF256_MUL_TABLE[auVar28._0_8_],0xe);
      lVar16 = vpextrq_avx(auVar28,1);
      auVar1 = vpinsrb_avx(auVar1,(uint)GF256Ctx.GF256_MUL_TABLE[lVar16],0xf);
      uVar2 = *(undefined8 *)(GF256Ctx.GF256_MUL_TABLE + lVar14);
      uVar3 = *(undefined8 *)(GF256Ctx.GF256_MUL_TABLE + lVar14 + 8);
      m_SelfTestBuffers.A[0] = (uint8_t)uVar2;
      m_SelfTestBuffers.A[1] = (uint8_t)((ulong)uVar2 >> 8);
      m_SelfTestBuffers.A[2] = (uint8_t)((ulong)uVar2 >> 0x10);
      m_SelfTestBuffers.A[3] = (uint8_t)((ulong)uVar2 >> 0x18);
      m_SelfTestBuffers.A[4] = (uint8_t)((ulong)uVar2 >> 0x20);
      m_SelfTestBuffers.A[5] = (uint8_t)((ulong)uVar2 >> 0x28);
      m_SelfTestBuffers.A[6] = (uint8_t)((ulong)uVar2 >> 0x30);
      m_SelfTestBuffers.A[7] = (uint8_t)((ulong)uVar2 >> 0x38);
      m_SelfTestBuffers.A[8] = (uint8_t)uVar3;
      m_SelfTestBuffers.A[9] = (uint8_t)((ulong)uVar3 >> 8);
      m_SelfTestBuffers.A[10] = (uint8_t)((ulong)uVar3 >> 0x10);
      m_SelfTestBuffers.A[0xb] = (uint8_t)((ulong)uVar3 >> 0x18);
      m_SelfTestBuffers.A[0xc] = (uint8_t)((ulong)uVar3 >> 0x20);
      m_SelfTestBuffers.A[0xd] = (uint8_t)((ulong)uVar3 >> 0x28);
      m_SelfTestBuffers.A[0xe] = (uint8_t)((ulong)uVar3 >> 0x30);
      m_SelfTestBuffers.A[0xf] = (uint8_t)((ulong)uVar3 >> 0x38);
      *(undefined8 *)(m_Packet + lVar12 + 0xf090) = uVar2;
      *(undefined8 *)(m_Packet + lVar12 + 0xf098) = uVar3;
      *(undefined1 (*) [16])((long)GF256Ctx.MM128.TABLE_LO_Y[0] + lVar12) = auVar1;
      if ((bVar19 & 1) != 0) {
        *(undefined8 *)((long)GF256Ctx.MM128.TABLE_LO_Y[1] + lVar12 * 2) = uVar2;
        *(undefined8 *)((long)GF256Ctx.MM128.TABLE_LO_Y[1] + lVar12 * 2 + 8) = uVar3;
        *(undefined8 *)((long)GF256Ctx.MM128.TABLE_LO_Y[0] + lVar12 * 2) = uVar2;
        *(undefined8 *)((long)GF256Ctx.MM128.TABLE_LO_Y[0] + lVar12 * 2 + 8) = uVar3;
        *(undefined1 (*) [16])((long)GF256Ctx.MM256.TABLE_LO_Y[0] + lVar12 * 2 + 0x10) = auVar1;
        *(undefined1 (*) [16])((long)GF256Ctx.MM256.TABLE_LO_Y[0] + lVar12 * 2) = auVar1;
      }
      lVar12 = lVar12 + 0x10;
      lVar14 = lVar14 + 0x100;
    } while (lVar12 != 0x2000);
    lVar12 = 0x1e7e80;
    uVar15 = 0;
    do {
      lVar14 = 0;
      uVar23 = 0;
      do {
        uVar24 = (ulong)*(byte *)(lVar12 + lVar14);
        if (lVar14 == 0 || uVar15 == 0) {
          if (uVar24 != 0) {
            m_SelfTestBuffers.B[0] = auVar1[0];
            m_SelfTestBuffers.B[1] = auVar1[1];
            m_SelfTestBuffers.B[2] = auVar1[2];
            m_SelfTestBuffers.B[3] = auVar1[3];
            m_SelfTestBuffers.B[4] = auVar1[4];
            m_SelfTestBuffers.B[5] = auVar1[5];
            m_SelfTestBuffers.B[6] = auVar1[6];
            m_SelfTestBuffers.B[7] = auVar1[7];
            m_SelfTestBuffers.B[8] = auVar1[8];
            m_SelfTestBuffers.B[9] = auVar1[9];
            m_SelfTestBuffers.B[10] = auVar1[10];
            m_SelfTestBuffers.B[0xb] = auVar1[0xb];
            m_SelfTestBuffers.B[0xc] = auVar1[0xc];
            m_SelfTestBuffers.B[0xd] = auVar1[0xd];
            m_SelfTestBuffers.B[0xe] = auVar1[0xe];
            m_SelfTestBuffers.B[0xf] = auVar1[0xf];
            return -3;
          }
          uVar24 = 0;
        }
        else {
          if (uVar23 != GF256Ctx.GF256_DIV_TABLE[uVar15 << 8 | uVar24]) {
            m_SelfTestBuffers.B[0] = auVar1[0];
            m_SelfTestBuffers.B[1] = auVar1[1];
            m_SelfTestBuffers.B[2] = auVar1[2];
            m_SelfTestBuffers.B[3] = auVar1[3];
            m_SelfTestBuffers.B[4] = auVar1[4];
            m_SelfTestBuffers.B[5] = auVar1[5];
            m_SelfTestBuffers.B[6] = auVar1[6];
            m_SelfTestBuffers.B[7] = auVar1[7];
            m_SelfTestBuffers.B[8] = auVar1[8];
            m_SelfTestBuffers.B[9] = auVar1[9];
            m_SelfTestBuffers.B[10] = auVar1[10];
            m_SelfTestBuffers.B[0xb] = auVar1[0xb];
            m_SelfTestBuffers.B[0xc] = auVar1[0xc];
            m_SelfTestBuffers.B[0xd] = auVar1[0xd];
            m_SelfTestBuffers.B[0xe] = auVar1[0xe];
            m_SelfTestBuffers.B[0xf] = auVar1[0xf];
            return -3;
          }
          if (uVar15 != *(byte *)(lVar14 + uVar24 + 0x1f7e80)) {
            m_SelfTestBuffers.B[0] = auVar1[0];
            m_SelfTestBuffers.B[1] = auVar1[1];
            m_SelfTestBuffers.B[2] = auVar1[2];
            m_SelfTestBuffers.B[3] = auVar1[3];
            m_SelfTestBuffers.B[4] = auVar1[4];
            m_SelfTestBuffers.B[5] = auVar1[5];
            m_SelfTestBuffers.B[6] = auVar1[6];
            m_SelfTestBuffers.B[7] = auVar1[7];
            m_SelfTestBuffers.B[8] = auVar1[8];
            m_SelfTestBuffers.B[9] = auVar1[9];
            m_SelfTestBuffers.B[10] = auVar1[10];
            m_SelfTestBuffers.B[0xb] = auVar1[0xb];
            m_SelfTestBuffers.B[0xc] = auVar1[0xc];
            m_SelfTestBuffers.B[0xd] = auVar1[0xd];
            m_SelfTestBuffers.B[0xe] = auVar1[0xe];
            m_SelfTestBuffers.B[0xf] = auVar1[0xf];
            return -3;
          }
        }
        iVar17 = -3;
        if ((lVar14 == 0x100) && (uVar15 != uVar24)) {
          m_SelfTestBuffers.B[0] = auVar1[0];
          m_SelfTestBuffers.B[1] = auVar1[1];
          m_SelfTestBuffers.B[2] = auVar1[2];
          m_SelfTestBuffers.B[3] = auVar1[3];
          m_SelfTestBuffers.B[4] = auVar1[4];
          m_SelfTestBuffers.B[5] = auVar1[5];
          m_SelfTestBuffers.B[6] = auVar1[6];
          m_SelfTestBuffers.B[7] = auVar1[7];
          m_SelfTestBuffers.B[8] = auVar1[8];
          m_SelfTestBuffers.B[9] = auVar1[9];
          m_SelfTestBuffers.B[10] = auVar1[10];
          m_SelfTestBuffers.B[0xb] = auVar1[0xb];
          m_SelfTestBuffers.B[0xc] = auVar1[0xc];
          m_SelfTestBuffers.B[0xd] = auVar1[0xd];
          m_SelfTestBuffers.B[0xe] = auVar1[0xe];
          m_SelfTestBuffers.B[0xf] = auVar1[0xf];
          return -3;
        }
        uVar23 = uVar23 + 1;
        lVar14 = lVar14 + 0x100;
      } while (lVar14 != 0x10000);
      uVar15 = uVar15 + 1;
      lVar12 = lVar12 + 1;
    } while (uVar15 != 0x100);
    builtin_memcpy(m_SelfTestBuffers.A,
                   "\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1fZ"
                   ,0x40);
    m_SelfTestBuffers.B[0x3f] = 'Z';
    m_SelfTestBuffers.C[0x3f] = 'Z';
    m_SelfTestBuffers.B[8] = 0xf7;
    m_SelfTestBuffers.B[0] = 0xf7;
    m_SelfTestBuffers.B[1] = 0xf7;
    m_SelfTestBuffers.B[2] = 0xf7;
    m_SelfTestBuffers.B[3] = 0xf7;
    m_SelfTestBuffers.B[4] = 0xf7;
    m_SelfTestBuffers.B[5] = 0xf7;
    m_SelfTestBuffers.B[6] = 0xf7;
    m_SelfTestBuffers.B[7] = 0xf7;
    m_SelfTestBuffers.B[9] = 0xf7;
    m_SelfTestBuffers.B[10] = 0xf7;
    m_SelfTestBuffers.B[0xb] = 0xf7;
    m_SelfTestBuffers.B[0xc] = 0xf7;
    m_SelfTestBuffers.B[0xd] = 0xf7;
    m_SelfTestBuffers.B[0xe] = 0xf7;
    m_SelfTestBuffers.B[0xf] = 0xf7;
    m_SelfTestBuffers.B[0x10] = 0xf7;
    m_SelfTestBuffers.B[0x11] = 0xf7;
    m_SelfTestBuffers.B[0x12] = 0xf7;
    m_SelfTestBuffers.B[0x13] = 0xf7;
    m_SelfTestBuffers.B[0x14] = 0xf7;
    m_SelfTestBuffers.B[0x15] = 0xf7;
    m_SelfTestBuffers.B[0x16] = 0xf7;
    m_SelfTestBuffers.B[0x17] = 0xf7;
    m_SelfTestBuffers.B[0x18] = 0xf7;
    m_SelfTestBuffers.B[0x19] = 0xf7;
    m_SelfTestBuffers.B[0x1a] = 0xf7;
    m_SelfTestBuffers.B[0x1b] = 0xf7;
    m_SelfTestBuffers.B[0x1c] = 0xf7;
    m_SelfTestBuffers.B[0x1d] = 0xf7;
    m_SelfTestBuffers.B[0x1e] = 0xf7;
    m_SelfTestBuffers.B[0x1f] = 0xf7;
    m_SelfTestBuffers.B[0x20] = 0xf7;
    m_SelfTestBuffers.B[0x21] = 0xf7;
    m_SelfTestBuffers.B[0x22] = 0xf7;
    m_SelfTestBuffers.B[0x23] = 0xf7;
    m_SelfTestBuffers.B[0x24] = 0xf7;
    m_SelfTestBuffers.B[0x25] = 0xf7;
    m_SelfTestBuffers.B[0x26] = 0xf7;
    m_SelfTestBuffers.B[0x27] = 0xf7;
    m_SelfTestBuffers.B[0x28] = 0xf7;
    m_SelfTestBuffers.B[0x29] = 0xf7;
    m_SelfTestBuffers.B[0x2a] = 0xf7;
    m_SelfTestBuffers.B[0x2b] = 0xf7;
    m_SelfTestBuffers.B[0x2c] = 0xf7;
    m_SelfTestBuffers.B[0x2d] = 0xf7;
    m_SelfTestBuffers.B[0x2e] = 0xf7;
    m_SelfTestBuffers.B[0x2f] = 0xf7;
    m_SelfTestBuffers.B[0x30] = 0xf7;
    m_SelfTestBuffers.B[0x31] = 0xf7;
    m_SelfTestBuffers.B[0x32] = 0xf7;
    m_SelfTestBuffers.B[0x33] = 0xf7;
    m_SelfTestBuffers.B[0x34] = 0xf7;
    m_SelfTestBuffers.B[0x35] = 0xf7;
    m_SelfTestBuffers.B[0x36] = 0xf7;
    m_SelfTestBuffers.B[0x37] = 0xf7;
    m_SelfTestBuffers.B[0x38] = 0xf7;
    m_SelfTestBuffers.B[0x39] = 0xf7;
    m_SelfTestBuffers.B[0x3a] = 0xf7;
    m_SelfTestBuffers.B[0x3b] = 0xf7;
    m_SelfTestBuffers.B[0x3c] = 0xf7;
    m_SelfTestBuffers.B[0x3d] = 0xf7;
    m_SelfTestBuffers.B[0x3e] = 0xf7;
    gf256_add_mem(&m_SelfTestBuffers,m_SelfTestBuffers.B,0x3f);
    lVar12 = 0;
    do {
      if (m_SelfTestBuffers.A[lVar12] != 0xe8) {
        return -3;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x3f);
    builtin_memcpy(m_SelfTestBuffers.A,
                   "\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f\x1f"
                   ,0x3f);
    m_SelfTestBuffers.B[8] = 0xf7;
    m_SelfTestBuffers.B[0] = 0xf7;
    m_SelfTestBuffers.B[1] = 0xf7;
    m_SelfTestBuffers.B[2] = 0xf7;
    m_SelfTestBuffers.B[3] = 0xf7;
    m_SelfTestBuffers.B[4] = 0xf7;
    m_SelfTestBuffers.B[5] = 0xf7;
    m_SelfTestBuffers.B[6] = 0xf7;
    m_SelfTestBuffers.B[7] = 0xf7;
    m_SelfTestBuffers.B[9] = 0xf7;
    m_SelfTestBuffers.B[10] = 0xf7;
    m_SelfTestBuffers.B[0xb] = 0xf7;
    m_SelfTestBuffers.B[0xc] = 0xf7;
    m_SelfTestBuffers.B[0xd] = 0xf7;
    m_SelfTestBuffers.B[0xe] = 0xf7;
    m_SelfTestBuffers.B[0xf] = 0xf7;
    m_SelfTestBuffers.B[0x10] = 0xf7;
    m_SelfTestBuffers.B[0x11] = 0xf7;
    m_SelfTestBuffers.B[0x12] = 0xf7;
    m_SelfTestBuffers.B[0x13] = 0xf7;
    m_SelfTestBuffers.B[0x14] = 0xf7;
    m_SelfTestBuffers.B[0x15] = 0xf7;
    m_SelfTestBuffers.B[0x16] = 0xf7;
    m_SelfTestBuffers.B[0x17] = 0xf7;
    m_SelfTestBuffers.B[0x18] = 0xf7;
    m_SelfTestBuffers.B[0x19] = 0xf7;
    m_SelfTestBuffers.B[0x1a] = 0xf7;
    m_SelfTestBuffers.B[0x1b] = 0xf7;
    m_SelfTestBuffers.B[0x1c] = 0xf7;
    m_SelfTestBuffers.B[0x1d] = 0xf7;
    m_SelfTestBuffers.B[0x1e] = 0xf7;
    m_SelfTestBuffers.B[0x1f] = 0xf7;
    m_SelfTestBuffers.B[0x20] = 0xf7;
    m_SelfTestBuffers.B[0x21] = 0xf7;
    m_SelfTestBuffers.B[0x22] = 0xf7;
    m_SelfTestBuffers.B[0x23] = 0xf7;
    m_SelfTestBuffers.B[0x24] = 0xf7;
    m_SelfTestBuffers.B[0x25] = 0xf7;
    m_SelfTestBuffers.B[0x26] = 0xf7;
    m_SelfTestBuffers.B[0x27] = 0xf7;
    m_SelfTestBuffers.B[0x28] = 0xf7;
    m_SelfTestBuffers.B[0x29] = 0xf7;
    m_SelfTestBuffers.B[0x2a] = 0xf7;
    m_SelfTestBuffers.B[0x2b] = 0xf7;
    m_SelfTestBuffers.B[0x2c] = 0xf7;
    m_SelfTestBuffers.B[0x2d] = 0xf7;
    m_SelfTestBuffers.B[0x2e] = 0xf7;
    m_SelfTestBuffers.B[0x2f] = 0xf7;
    m_SelfTestBuffers.B[0x30] = 0xf7;
    m_SelfTestBuffers.B[0x31] = 0xf7;
    m_SelfTestBuffers.B[0x32] = 0xf7;
    m_SelfTestBuffers.B[0x33] = 0xf7;
    m_SelfTestBuffers.B[0x34] = 0xf7;
    m_SelfTestBuffers.B[0x35] = 0xf7;
    m_SelfTestBuffers.B[0x36] = 0xf7;
    m_SelfTestBuffers.B[0x37] = 0xf7;
    m_SelfTestBuffers.B[0x38] = 0xf7;
    m_SelfTestBuffers.B[0x39] = 0xf7;
    m_SelfTestBuffers.B[0x3a] = 0xf7;
    m_SelfTestBuffers.B[0x3b] = 0xf7;
    m_SelfTestBuffers.B[0x3c] = 0xf7;
    m_SelfTestBuffers.B[0x3d] = 0xf7;
    m_SelfTestBuffers.B[0x3e] = 0xf7;
    builtin_memcpy(m_SelfTestBuffers.C,
                   "qqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqqq",0x3f);
    gf256_add2_mem(&m_SelfTestBuffers,m_SelfTestBuffers.B,m_SelfTestBuffers.C,0x3f);
    lVar12 = 0;
    do {
      if (m_SelfTestBuffers.A[lVar12] != 0x99) {
        return -3;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x3f);
    builtin_memcpy(m_SelfTestBuffers.A + 0x1f,"UUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUU",0x20);
    m_SelfTestBuffers.A[0] = 'U';
    m_SelfTestBuffers.B[8] = 0xaa;
    m_SelfTestBuffers.B[0] = 0xaa;
    m_SelfTestBuffers.B[1] = 0xaa;
    m_SelfTestBuffers.B[2] = 0xaa;
    m_SelfTestBuffers.B[3] = 0xaa;
    m_SelfTestBuffers.B[4] = 0xaa;
    m_SelfTestBuffers.B[5] = 0xaa;
    m_SelfTestBuffers.B[6] = 0xaa;
    m_SelfTestBuffers.B[7] = 0xaa;
    m_SelfTestBuffers.B[9] = 0xaa;
    m_SelfTestBuffers.B[10] = 0xaa;
    m_SelfTestBuffers.B[0xb] = 0xaa;
    m_SelfTestBuffers.B[0xc] = 0xaa;
    m_SelfTestBuffers.B[0xd] = 0xaa;
    m_SelfTestBuffers.B[0xe] = 0xaa;
    m_SelfTestBuffers.B[0xf] = 0xaa;
    m_SelfTestBuffers.B[0x10] = 0xaa;
    m_SelfTestBuffers.B[0x11] = 0xaa;
    m_SelfTestBuffers.B[0x12] = 0xaa;
    m_SelfTestBuffers.B[0x13] = 0xaa;
    m_SelfTestBuffers.B[0x14] = 0xaa;
    m_SelfTestBuffers.B[0x15] = 0xaa;
    m_SelfTestBuffers.B[0x16] = 0xaa;
    m_SelfTestBuffers.B[0x17] = 0xaa;
    m_SelfTestBuffers.B[0x18] = 0xaa;
    m_SelfTestBuffers.B[0x19] = 0xaa;
    m_SelfTestBuffers.B[0x1a] = 0xaa;
    m_SelfTestBuffers.B[0x1b] = 0xaa;
    m_SelfTestBuffers.B[0x1c] = 0xaa;
    m_SelfTestBuffers.B[0x1d] = 0xaa;
    m_SelfTestBuffers.B[0x1e] = 0xaa;
    m_SelfTestBuffers.B[0x1f] = 0xaa;
    m_SelfTestBuffers.B[0x20] = 0xaa;
    m_SelfTestBuffers.B[0x21] = 0xaa;
    m_SelfTestBuffers.B[0x22] = 0xaa;
    m_SelfTestBuffers.B[0x23] = 0xaa;
    m_SelfTestBuffers.B[0x24] = 0xaa;
    m_SelfTestBuffers.B[0x25] = 0xaa;
    m_SelfTestBuffers.B[0x26] = 0xaa;
    m_SelfTestBuffers.B[0x27] = 0xaa;
    m_SelfTestBuffers.B[0x28] = 0xaa;
    m_SelfTestBuffers.B[0x29] = 0xaa;
    m_SelfTestBuffers.B[0x2a] = 0xaa;
    m_SelfTestBuffers.B[0x2b] = 0xaa;
    m_SelfTestBuffers.B[0x2c] = 0xaa;
    m_SelfTestBuffers.B[0x2d] = 0xaa;
    m_SelfTestBuffers.B[0x2e] = 0xaa;
    m_SelfTestBuffers.B[0x2f] = 0xaa;
    m_SelfTestBuffers.B[0x30] = 0xaa;
    m_SelfTestBuffers.B[0x31] = 0xaa;
    m_SelfTestBuffers.B[0x32] = 0xaa;
    m_SelfTestBuffers.B[0x33] = 0xaa;
    m_SelfTestBuffers.B[0x34] = 0xaa;
    m_SelfTestBuffers.B[0x35] = 0xaa;
    m_SelfTestBuffers.B[0x36] = 0xaa;
    m_SelfTestBuffers.B[0x37] = 0xaa;
    m_SelfTestBuffers.B[0x38] = 0xaa;
    m_SelfTestBuffers.B[0x39] = 0xaa;
    m_SelfTestBuffers.B[0x3a] = 0xaa;
    m_SelfTestBuffers.B[0x3b] = 0xaa;
    m_SelfTestBuffers.B[0x3c] = 0xaa;
    m_SelfTestBuffers.B[0x3d] = 0xaa;
    m_SelfTestBuffers.B[0x3e] = 0xaa;
    builtin_memcpy(m_SelfTestBuffers.C,
                   "lllllllllllllllllllllllllllllllllllllllllllllllllllllllllllllll",0x3f);
    auVar50 = ZEXT1632(CONCAT115(0x55,CONCAT114(0x55,CONCAT113(0x55,CONCAT112(0x55,CONCAT111(0x55,
                                                  CONCAT110(0x55,CONCAT19(0x55,CONCAT18(0x55,
                                                  0x5555555555555555)))))))));
    m_SelfTestBuffers.A[1] = m_SelfTestBuffers.A[0x20];
    m_SelfTestBuffers.A[2] = m_SelfTestBuffers.A[0x21];
    m_SelfTestBuffers.A[3] = m_SelfTestBuffers.A[0x22];
    m_SelfTestBuffers.A[4] = m_SelfTestBuffers.A[0x23];
    m_SelfTestBuffers.A[5] = m_SelfTestBuffers.A[0x24];
    m_SelfTestBuffers.A[6] = m_SelfTestBuffers.A[0x25];
    m_SelfTestBuffers.A[7] = m_SelfTestBuffers.A[0x26];
    m_SelfTestBuffers.A[8] = m_SelfTestBuffers.A[0x27];
    m_SelfTestBuffers.A[9] = m_SelfTestBuffers.A[0x28];
    m_SelfTestBuffers.A[10] = m_SelfTestBuffers.A[0x29];
    m_SelfTestBuffers.A[0xb] = m_SelfTestBuffers.A[0x2a];
    m_SelfTestBuffers.A[0xc] = m_SelfTestBuffers.A[0x2b];
    m_SelfTestBuffers.A[0xd] = m_SelfTestBuffers.A[0x2c];
    m_SelfTestBuffers.A[0xe] = m_SelfTestBuffers.A[0x2d];
    m_SelfTestBuffers.A[0xf] = m_SelfTestBuffers.A[0x2e];
    m_SelfTestBuffers.A[0x10] = m_SelfTestBuffers.A[0x2f];
    m_SelfTestBuffers.A[0x11] = m_SelfTestBuffers.A[0x30];
    m_SelfTestBuffers.A[0x12] = m_SelfTestBuffers.A[0x31];
    m_SelfTestBuffers.A[0x13] = m_SelfTestBuffers.A[0x32];
    m_SelfTestBuffers.A[0x14] = m_SelfTestBuffers.A[0x33];
    m_SelfTestBuffers.A[0x15] = m_SelfTestBuffers.A[0x34];
    m_SelfTestBuffers.A[0x16] = m_SelfTestBuffers.A[0x35];
    m_SelfTestBuffers.A[0x17] = m_SelfTestBuffers.A[0x36];
    m_SelfTestBuffers.A[0x18] = m_SelfTestBuffers.A[0x37];
    m_SelfTestBuffers.A[0x19] = m_SelfTestBuffers.A[0x38];
    m_SelfTestBuffers.A[0x1a] = m_SelfTestBuffers.A[0x39];
    m_SelfTestBuffers.A[0x1b] = m_SelfTestBuffers.A[0x3a];
    m_SelfTestBuffers.A[0x1c] = m_SelfTestBuffers.A[0x3b];
    m_SelfTestBuffers.A[0x1d] = m_SelfTestBuffers.A[0x3c];
    m_SelfTestBuffers.A[0x1e] = m_SelfTestBuffers.A[0x3d];
    gf256_addset_mem(&m_SelfTestBuffers,m_SelfTestBuffers.B,m_SelfTestBuffers.C,0x3f);
    uVar11 = GF256Ctx.GF256_MUL_TABLE[0x6caa];
    lVar12 = 0;
    do {
      if (m_SelfTestBuffers.A[lVar12] != 0xc6) {
        return -3;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x3f);
    auVar50 = vpcmpeqd_avx2(auVar50,auVar50);
    m_SelfTestBuffers.A[0x20] = auVar50[1];
    m_SelfTestBuffers.A[0x21] = auVar50[2];
    m_SelfTestBuffers.A[0x22] = auVar50[3];
    m_SelfTestBuffers.A[0x23] = auVar50[4];
    m_SelfTestBuffers.A[0x24] = auVar50[5];
    m_SelfTestBuffers.A[0x25] = auVar50[6];
    m_SelfTestBuffers.A[0x26] = auVar50[7];
    m_SelfTestBuffers.A[0x27] = auVar50[8];
    m_SelfTestBuffers.A[0x28] = auVar50[9];
    m_SelfTestBuffers.A[0x29] = auVar50[10];
    m_SelfTestBuffers.A[0x2a] = auVar50[0xb];
    m_SelfTestBuffers.A[0x2b] = auVar50[0xc];
    m_SelfTestBuffers.A[0x2c] = auVar50[0xd];
    m_SelfTestBuffers.A[0x2d] = auVar50[0xe];
    m_SelfTestBuffers.A[0x2e] = auVar50[0xf];
    m_SelfTestBuffers.A[0x2f] = auVar50[0x10];
    m_SelfTestBuffers.A[0x30] = auVar50[0x11];
    m_SelfTestBuffers.A[0x31] = auVar50[0x12];
    m_SelfTestBuffers.A[0x32] = auVar50[0x13];
    m_SelfTestBuffers.A[0x33] = auVar50[0x14];
    m_SelfTestBuffers.A[0x34] = auVar50[0x15];
    m_SelfTestBuffers.A[0x35] = auVar50[0x16];
    m_SelfTestBuffers.A[0x36] = auVar50[0x17];
    m_SelfTestBuffers.A[0x37] = auVar50[0x18];
    m_SelfTestBuffers.A[0x38] = auVar50[0x19];
    m_SelfTestBuffers.A[0x39] = auVar50[0x1a];
    m_SelfTestBuffers.A[0x3a] = auVar50[0x1b];
    m_SelfTestBuffers.A[0x3b] = auVar50[0x1c];
    m_SelfTestBuffers.A[0x3c] = auVar50[0x1d];
    m_SelfTestBuffers.A[0x3d] = auVar50[0x1e];
    m_SelfTestBuffers.A[0x3e] = auVar50[0x1f];
    m_SelfTestBuffers.A[0] = auVar50[0];
    m_SelfTestBuffers.B[8] = 0xaa;
    m_SelfTestBuffers.B[0] = 0xaa;
    m_SelfTestBuffers.B[1] = 0xaa;
    m_SelfTestBuffers.B[2] = 0xaa;
    m_SelfTestBuffers.B[3] = 0xaa;
    m_SelfTestBuffers.B[4] = 0xaa;
    m_SelfTestBuffers.B[5] = 0xaa;
    m_SelfTestBuffers.B[6] = 0xaa;
    m_SelfTestBuffers.B[7] = 0xaa;
    m_SelfTestBuffers.B[9] = 0xaa;
    m_SelfTestBuffers.B[10] = 0xaa;
    m_SelfTestBuffers.B[0xb] = 0xaa;
    m_SelfTestBuffers.B[0xc] = 0xaa;
    m_SelfTestBuffers.B[0xd] = 0xaa;
    m_SelfTestBuffers.B[0xe] = 0xaa;
    m_SelfTestBuffers.B[0xf] = 0xaa;
    m_SelfTestBuffers.B[0x10] = 0xaa;
    m_SelfTestBuffers.B[0x11] = 0xaa;
    m_SelfTestBuffers.B[0x12] = 0xaa;
    m_SelfTestBuffers.B[0x13] = 0xaa;
    m_SelfTestBuffers.B[0x14] = 0xaa;
    m_SelfTestBuffers.B[0x15] = 0xaa;
    m_SelfTestBuffers.B[0x16] = 0xaa;
    m_SelfTestBuffers.B[0x17] = 0xaa;
    m_SelfTestBuffers.B[0x18] = 0xaa;
    m_SelfTestBuffers.B[0x19] = 0xaa;
    m_SelfTestBuffers.B[0x1a] = 0xaa;
    m_SelfTestBuffers.B[0x1b] = 0xaa;
    m_SelfTestBuffers.B[0x1c] = 0xaa;
    m_SelfTestBuffers.B[0x1d] = 0xaa;
    m_SelfTestBuffers.B[0x1e] = 0xaa;
    m_SelfTestBuffers.B[0x1f] = 0xaa;
    m_SelfTestBuffers.B[0x20] = 0xaa;
    m_SelfTestBuffers.B[0x21] = 0xaa;
    m_SelfTestBuffers.B[0x22] = 0xaa;
    m_SelfTestBuffers.B[0x23] = 0xaa;
    m_SelfTestBuffers.B[0x24] = 0xaa;
    m_SelfTestBuffers.B[0x25] = 0xaa;
    m_SelfTestBuffers.B[0x26] = 0xaa;
    m_SelfTestBuffers.B[0x27] = 0xaa;
    m_SelfTestBuffers.B[0x28] = 0xaa;
    m_SelfTestBuffers.B[0x29] = 0xaa;
    m_SelfTestBuffers.B[0x2a] = 0xaa;
    m_SelfTestBuffers.B[0x2b] = 0xaa;
    m_SelfTestBuffers.B[0x2c] = 0xaa;
    m_SelfTestBuffers.B[0x2d] = 0xaa;
    m_SelfTestBuffers.B[0x2e] = 0xaa;
    m_SelfTestBuffers.B[0x2f] = 0xaa;
    m_SelfTestBuffers.B[0x30] = 0xaa;
    m_SelfTestBuffers.B[0x31] = 0xaa;
    m_SelfTestBuffers.B[0x32] = 0xaa;
    m_SelfTestBuffers.B[0x33] = 0xaa;
    m_SelfTestBuffers.B[0x34] = 0xaa;
    m_SelfTestBuffers.B[0x35] = 0xaa;
    m_SelfTestBuffers.B[0x36] = 0xaa;
    m_SelfTestBuffers.B[0x37] = 0xaa;
    m_SelfTestBuffers.B[0x38] = 0xaa;
    m_SelfTestBuffers.B[0x39] = 0xaa;
    m_SelfTestBuffers.B[0x3a] = 0xaa;
    m_SelfTestBuffers.B[0x3b] = 0xaa;
    m_SelfTestBuffers.B[0x3c] = 0xaa;
    m_SelfTestBuffers.B[0x3d] = 0xaa;
    m_SelfTestBuffers.B[0x3e] = 0xaa;
    auVar50 = ZEXT1632(auVar50._0_16_);
    m_SelfTestBuffers.A[1] = m_SelfTestBuffers.A[0x20];
    m_SelfTestBuffers.A[2] = m_SelfTestBuffers.A[0x21];
    m_SelfTestBuffers.A[3] = m_SelfTestBuffers.A[0x22];
    m_SelfTestBuffers.A[4] = m_SelfTestBuffers.A[0x23];
    m_SelfTestBuffers.A[5] = m_SelfTestBuffers.A[0x24];
    m_SelfTestBuffers.A[6] = m_SelfTestBuffers.A[0x25];
    m_SelfTestBuffers.A[7] = m_SelfTestBuffers.A[0x26];
    m_SelfTestBuffers.A[8] = m_SelfTestBuffers.A[0x27];
    m_SelfTestBuffers.A[9] = m_SelfTestBuffers.A[0x28];
    m_SelfTestBuffers.A[10] = m_SelfTestBuffers.A[0x29];
    m_SelfTestBuffers.A[0xb] = m_SelfTestBuffers.A[0x2a];
    m_SelfTestBuffers.A[0xc] = m_SelfTestBuffers.A[0x2b];
    m_SelfTestBuffers.A[0xd] = m_SelfTestBuffers.A[0x2c];
    m_SelfTestBuffers.A[0xe] = m_SelfTestBuffers.A[0x2d];
    m_SelfTestBuffers.A[0xf] = m_SelfTestBuffers.A[0x2e];
    m_SelfTestBuffers.A[0x10] = m_SelfTestBuffers.A[0x2f];
    m_SelfTestBuffers.A[0x11] = m_SelfTestBuffers.A[0x30];
    m_SelfTestBuffers.A[0x12] = m_SelfTestBuffers.A[0x31];
    m_SelfTestBuffers.A[0x13] = m_SelfTestBuffers.A[0x32];
    m_SelfTestBuffers.A[0x14] = m_SelfTestBuffers.A[0x33];
    m_SelfTestBuffers.A[0x15] = m_SelfTestBuffers.A[0x34];
    m_SelfTestBuffers.A[0x16] = m_SelfTestBuffers.A[0x35];
    m_SelfTestBuffers.A[0x17] = m_SelfTestBuffers.A[0x36];
    m_SelfTestBuffers.A[0x18] = m_SelfTestBuffers.A[0x37];
    m_SelfTestBuffers.A[0x19] = m_SelfTestBuffers.A[0x38];
    m_SelfTestBuffers.A[0x1a] = m_SelfTestBuffers.A[0x39];
    m_SelfTestBuffers.A[0x1b] = m_SelfTestBuffers.A[0x3a];
    m_SelfTestBuffers.A[0x1c] = m_SelfTestBuffers.A[0x3b];
    m_SelfTestBuffers.A[0x1d] = m_SelfTestBuffers.A[0x3c];
    m_SelfTestBuffers.A[0x1e] = m_SelfTestBuffers.A[0x3d];
    m_SelfTestBuffers.A[0x1f] = m_SelfTestBuffers.A[0x3e];
    gf256_muladd_mem(&m_SelfTestBuffers,'l',m_SelfTestBuffers.B,0x3f);
    uVar10 = GF256Ctx.GF256_MUL_TABLE[0x55a2];
    lVar12 = 0;
    do {
      if ((m_SelfTestBuffers.A[lVar12] ^ uVar11) != 0xff) {
        return -3;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x3f);
    auVar50 = vpcmpeqd_avx2(auVar50,auVar50);
    m_SelfTestBuffers.A[0x20] = auVar50[1];
    m_SelfTestBuffers.A[0x21] = auVar50[2];
    m_SelfTestBuffers.A[0x22] = auVar50[3];
    m_SelfTestBuffers.A[0x23] = auVar50[4];
    m_SelfTestBuffers.A[0x24] = auVar50[5];
    m_SelfTestBuffers.A[0x25] = auVar50[6];
    m_SelfTestBuffers.A[0x26] = auVar50[7];
    m_SelfTestBuffers.A[0x27] = auVar50[8];
    m_SelfTestBuffers.A[0x28] = auVar50[9];
    m_SelfTestBuffers.A[0x29] = auVar50[10];
    m_SelfTestBuffers.A[0x2a] = auVar50[0xb];
    m_SelfTestBuffers.A[0x2b] = auVar50[0xc];
    m_SelfTestBuffers.A[0x2c] = auVar50[0xd];
    m_SelfTestBuffers.A[0x2d] = auVar50[0xe];
    m_SelfTestBuffers.A[0x2e] = auVar50[0xf];
    m_SelfTestBuffers.A[0x2f] = auVar50[0x10];
    m_SelfTestBuffers.A[0x30] = auVar50[0x11];
    m_SelfTestBuffers.A[0x31] = auVar50[0x12];
    m_SelfTestBuffers.A[0x32] = auVar50[0x13];
    m_SelfTestBuffers.A[0x33] = auVar50[0x14];
    m_SelfTestBuffers.A[0x34] = auVar50[0x15];
    m_SelfTestBuffers.A[0x35] = auVar50[0x16];
    m_SelfTestBuffers.A[0x36] = auVar50[0x17];
    m_SelfTestBuffers.A[0x37] = auVar50[0x18];
    m_SelfTestBuffers.A[0x38] = auVar50[0x19];
    m_SelfTestBuffers.A[0x39] = auVar50[0x1a];
    m_SelfTestBuffers.A[0x3a] = auVar50[0x1b];
    m_SelfTestBuffers.A[0x3b] = auVar50[0x1c];
    m_SelfTestBuffers.A[0x3c] = auVar50[0x1d];
    m_SelfTestBuffers.A[0x3d] = auVar50[0x1e];
    m_SelfTestBuffers.A[0x3e] = auVar50[0x1f];
    m_SelfTestBuffers.A[0] = auVar50[0];
    builtin_memcpy(m_SelfTestBuffers.B + 8,"UUUUUUUU",8);
    builtin_memcpy(m_SelfTestBuffers.B,"UUUUUUUU",8);
    builtin_memcpy(m_SelfTestBuffers.B + 0x10,"UUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUUU",0x2f
                  );
    m_SelfTestBuffers.A[1] = m_SelfTestBuffers.A[0x20];
    m_SelfTestBuffers.A[2] = m_SelfTestBuffers.A[0x21];
    m_SelfTestBuffers.A[3] = m_SelfTestBuffers.A[0x22];
    m_SelfTestBuffers.A[4] = m_SelfTestBuffers.A[0x23];
    m_SelfTestBuffers.A[5] = m_SelfTestBuffers.A[0x24];
    m_SelfTestBuffers.A[6] = m_SelfTestBuffers.A[0x25];
    m_SelfTestBuffers.A[7] = m_SelfTestBuffers.A[0x26];
    m_SelfTestBuffers.A[8] = m_SelfTestBuffers.A[0x27];
    m_SelfTestBuffers.A[9] = m_SelfTestBuffers.A[0x28];
    m_SelfTestBuffers.A[10] = m_SelfTestBuffers.A[0x29];
    m_SelfTestBuffers.A[0xb] = m_SelfTestBuffers.A[0x2a];
    m_SelfTestBuffers.A[0xc] = m_SelfTestBuffers.A[0x2b];
    m_SelfTestBuffers.A[0xd] = m_SelfTestBuffers.A[0x2c];
    m_SelfTestBuffers.A[0xe] = m_SelfTestBuffers.A[0x2d];
    m_SelfTestBuffers.A[0xf] = m_SelfTestBuffers.A[0x2e];
    m_SelfTestBuffers.A[0x10] = m_SelfTestBuffers.A[0x2f];
    m_SelfTestBuffers.A[0x11] = m_SelfTestBuffers.A[0x30];
    m_SelfTestBuffers.A[0x12] = m_SelfTestBuffers.A[0x31];
    m_SelfTestBuffers.A[0x13] = m_SelfTestBuffers.A[0x32];
    m_SelfTestBuffers.A[0x14] = m_SelfTestBuffers.A[0x33];
    m_SelfTestBuffers.A[0x15] = m_SelfTestBuffers.A[0x34];
    m_SelfTestBuffers.A[0x16] = m_SelfTestBuffers.A[0x35];
    m_SelfTestBuffers.A[0x17] = m_SelfTestBuffers.A[0x36];
    m_SelfTestBuffers.A[0x18] = m_SelfTestBuffers.A[0x37];
    m_SelfTestBuffers.A[0x19] = m_SelfTestBuffers.A[0x38];
    m_SelfTestBuffers.A[0x1a] = m_SelfTestBuffers.A[0x39];
    m_SelfTestBuffers.A[0x1b] = m_SelfTestBuffers.A[0x3a];
    m_SelfTestBuffers.A[0x1c] = m_SelfTestBuffers.A[0x3b];
    m_SelfTestBuffers.A[0x1d] = m_SelfTestBuffers.A[0x3c];
    m_SelfTestBuffers.A[0x1e] = m_SelfTestBuffers.A[0x3d];
    m_SelfTestBuffers.A[0x1f] = m_SelfTestBuffers.A[0x3e];
    gf256_mul_mem(&m_SelfTestBuffers,m_SelfTestBuffers.B,0xa2,0x3f);
    lVar12 = 0;
    do {
      if (m_SelfTestBuffers.A[lVar12] != uVar10) {
        return -3;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0x3f);
    if ((m_SelfTestBuffers.A[0x3f] == 'Z') && (m_SelfTestBuffers.B[0x3f] == 'Z')) {
      iVar17 = (uint)(m_SelfTestBuffers.C[0x3f] == 'Z') * 3 + -3;
    }
  }
  return iVar17;
}

Assistant:

int gf256_init_(int version)
{
    if (version != GF256_VERSION)
        return -1; // User's header does not match library version.

    // Avoid multiple initialization
    if (Initialized)
        return 0;
    Initialized = true;

    if (!IsExpectedEndian())
        return -2; // Unexpected byte order.

    gf256_architecture_init();
    gf256_poly_init(kDefaultPolynomialIndex);
    gf256_explog_init();
    gf256_muldiv_init();
    gf256_inv_init();
    gf256_sqr_init();
    gf256_mul_mem_init();

    if (!gf256_self_test())
        return -3; // Self-test failed (perhaps untested configuration)

    return 0;
}